

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 01_feature.cc
# Opt level: O0

int main(void)

{
  Status SVar1;
  Door *pDVar2;
  int __oflag;
  int __oflag_00;
  int __fd;
  char *in_RSI;
  impl<ezy::strong_type<Door,_my_tag,_accessible>_> local_13;
  impl<ezy::strong_type<Door,_my_tag,_closable>_> local_12;
  impl<ezy::strong_type<Door,_my_tag,_openable>_> local_11;
  undefined4 local_10;
  RegularDoor d3;
  ClosableDoor d2;
  int iStack_c;
  OpenableDoor d1;
  AnswerableInt ans;
  
  iStack_c = 0;
  local_10 = 10;
  ezy::strong_type<Door,_my_tag,_openable>::strong_type
            ((strong_type<Door,_my_tag,_openable> *)&local_11);
  openable::impl<ezy::strong_type<Door,_my_tag,_openable>_>::open(&local_11,in_RSI,__oflag);
  pDVar2 = ezy::detail::strong_type_base<Door,_false>::get
                     ((strong_type_base<Door,_false> *)&local_11);
  SVar1 = Door::getStatus(pDVar2);
  if (SVar1 != Open) {
    __assert_fail("Door::Status::Open == d1.get().getStatus()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/howto/01_feature.cc"
                  ,0xc5,"int main()");
  }
  ezy::strong_type<Door,_my_tag,_closable>::strong_type
            ((strong_type<Door,_my_tag,_closable> *)&local_12);
  closable::impl<ezy::strong_type<Door,_my_tag,_closable>_>::close(&local_12,(int)in_RSI);
  pDVar2 = ezy::detail::strong_type_base<Door,_false>::get
                     ((strong_type_base<Door,_false> *)&local_12);
  SVar1 = Door::getStatus(pDVar2);
  if (SVar1 == Open) {
    __assert_fail("Door::Status::Closed == d2.get().getStatus()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/howto/01_feature.cc"
                  ,0xca,"int main()");
  }
  ezy::strong_type<Door,_my_tag,_accessible>::strong_type
            ((strong_type<Door,_my_tag,_accessible> *)&local_13);
  openable::impl<ezy::strong_type<Door,_my_tag,_accessible>_>::open(&local_13,in_RSI,__oflag_00);
  __fd = (int)in_RSI;
  pDVar2 = ezy::detail::strong_type_base<Door,_false>::get
                     ((strong_type_base<Door,_false> *)&local_13);
  SVar1 = Door::getStatus(pDVar2);
  if (SVar1 != Open) {
    __assert_fail("Door::Status::Open == d3.get().getStatus()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/howto/01_feature.cc"
                  ,0xd0,"int main()");
  }
  closable::impl<ezy::strong_type<Door,_my_tag,_accessible>_>::close
            ((impl<ezy::strong_type<Door,_my_tag,_accessible>_> *)&local_13,__fd);
  pDVar2 = ezy::detail::strong_type_base<Door,_false>::get
                     ((strong_type_base<Door,_false> *)&local_13);
  SVar1 = Door::getStatus(pDVar2);
  if (SVar1 != Open) {
    internalization();
    extend_with_secret();
    extend_with_secret2();
    return iStack_c;
  }
  __assert_fail("Door::Status::Closed == d3.get().getStatus()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/howto/01_feature.cc"
                ,0xd2,"int main()");
}

Assistant:

int main()
{
  using AnswerableInt = ezy::strong_type<int, struct my_tag, answerable>;
  constexpr AnswerableInt ans{10};
  static_assert(ans.answer() == 42);

  using OpenableDoor = ezy::strong_type<Door, struct my_tag, openable>;
  OpenableDoor d1;
  d1.open();
  assert(Door::Status::Open == d1.get().getStatus());

  using ClosableDoor = ezy::strong_type<Door, struct my_tag, closable>;
  ClosableDoor d2;
  d2.close();
  assert(Door::Status::Closed == d2.get().getStatus());

  //using RegularDoor = ezy::strong_type<Door, struct my_tag, openable, closable>;
  using RegularDoor = ezy::strong_type<Door, struct my_tag, accessible>;
  RegularDoor d3;
  d3.open();
  assert(Door::Status::Open == d3.get().getStatus());
  d3.close();
  assert(Door::Status::Closed == d3.get().getStatus());

  internalization();
  extend_with_secret();
  extend_with_secret2();
}